

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressure.cpp
# Opt level: O2

RTPressure * RTPressure::createPressure(RTIMUSettings *settings)

{
  bool bVar1;
  RTPressureMS5611 *this;
  RTPressureBMP180 *this_00;
  RTPressureMS5637 *this_01;
  RTPressureLPS25H *this_02;
  
LAB_0011b9a1:
  switch(settings->m_pressureType) {
  case 0:
    break;
  default:
    return (RTPressure *)0x0;
  case 2:
    this_00 = (RTPressureBMP180 *)operator_new(0x58);
    RTPressureBMP180::RTPressureBMP180(this_00,settings);
    return &this_00->super_RTPressure;
  case 3:
    this_02 = (RTPressureLPS25H *)operator_new(0x20);
    RTPressureLPS25H::RTPressureLPS25H(this_02,settings);
    return &this_02->super_RTPressure;
  case 4:
    this = (RTPressureMS5611 *)operator_new(0x48);
    RTPressureMS5611::RTPressureMS5611(this,settings);
    return &this->super_RTPressure;
  case 5:
    this_01 = (RTPressureMS5637 *)operator_new(0x48);
    RTPressureMS5637::RTPressureMS5637(this_01,settings);
    return &this_01->super_RTPressure;
  }
  bVar1 = RTIMUSettings::discoverPressure
                    (settings,&settings->m_pressureType,&settings->m_I2CPressureAddress);
  if (!bVar1) {
    return (RTPressure *)0x0;
  }
  (*(settings->super_RTIMUHal)._vptr_RTIMUHal[3])(settings);
  goto LAB_0011b9a1;
}

Assistant:

RTPressure *RTPressure::createPressure(RTIMUSettings *settings)
{
    switch (settings->m_pressureType) {
    case RTPRESSURE_TYPE_BMP180:
        return new RTPressureBMP180(settings);

    case RTPRESSURE_TYPE_LPS25H:
        return new RTPressureLPS25H(settings);

    case RTPRESSURE_TYPE_MS5611:
        return new RTPressureMS5611(settings);

    case RTPRESSURE_TYPE_MS5637:
        return new RTPressureMS5637(settings);

    case RTPRESSURE_TYPE_AUTODISCOVER:
        if (settings->discoverPressure(settings->m_pressureType, settings->m_I2CPressureAddress)) {
            settings->saveSettings();
            return RTPressure::createPressure(settings);
        }
        return NULL;

    case RTPRESSURE_TYPE_NULL:
        return NULL;

    default:
        return NULL;
    }
}